

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

bool __thiscall FMultiBlockThingsIterator::Next(FMultiBlockThingsIterator *this,CheckResult *item)

{
  short sVar1;
  uint uVar2;
  DWORD DVar3;
  DWORD DVar4;
  int nextflags;
  bool onlast;
  TVector3<double> local_40;
  AActor *local_28;
  AActor *thing;
  CheckResult *item_local;
  FMultiBlockThingsIterator *this_local;
  
  thing = (AActor *)item;
  item_local = (CheckResult *)this;
  local_28 = FBlockThingsIterator::Next(&this->blockIterator,false);
  if (local_28 == (AActor *)0x0) {
    sVar1 = this->index;
    uVar2 = FPortalGroupArray::Size(this->checklist);
    if ((int)sVar1 + 1U < uVar2) {
      DVar3 = FPortalGroupArray::operator[](this->checklist,(int)this->index + 1);
      this->index = this->index + 1;
      DVar4 = FPortalGroupArray::operator[](this->checklist,(int)this->index);
      startIteratorForGroup(this,DVar4 & 0xffff3fff);
      if ((DVar3 & 0xc000) == 0x4000) {
        this->portalflags = 0x40;
      }
      else if ((DVar3 & 0xc000) == 0x8000) {
        this->portalflags = 0x20;
      }
      else {
        this->portalflags = 0;
      }
      this_local._7_1_ = Next(this,(CheckResult *)thing);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    (thing->super_DThinker).super_DObject._vptr_DObject = (_func_int **)local_28;
    FDisplacementTable::getOffset((FDisplacementTable *)&nextflags,0x1af5e78,(int)this->basegroup);
    operator+(&local_40,&this->checkpoint,(Vector2 *)&nextflags);
    TVector3<double>::operator=
              ((TVector3<double> *)&(thing->super_DThinker).super_DObject.Class,&local_40);
    (thing->super_DThinker).super_DObject.ObjectFlags = (int)this->portalflags;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FMultiBlockThingsIterator::Next(FMultiBlockThingsIterator::CheckResult *item)
{
	AActor *thing = blockIterator.Next();
	if (thing != NULL)
	{
		item->thing = thing;
		item->Position = checkpoint + Displacements.getOffset(basegroup, thing->Sector->PortalGroup);
		item->portalflags = portalflags;
		return true;
	}
	bool onlast = unsigned(index + 1) >= checklist.Size();
	int nextflags = onlast ? 0 : checklist[index + 1] & FPortalGroupArray::FLAT;

	if (onlast)
	{
		return false;
	}

	index++;
	startIteratorForGroup(checklist[index] & ~FPortalGroupArray::FLAT);
	switch (nextflags)
	{
	case FPortalGroupArray::UPPER:
		portalflags = FFCF_NOFLOOR;
		break;

	case FPortalGroupArray::LOWER:
		portalflags = FFCF_NOCEILING;
		break;

	default:
		portalflags = 0;
	}

	return Next(item);
}